

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O2

string * __thiscall
pbrt::ParameterDictionary::ToParameterList_abi_cxx11_
          (string *__return_storage_ptr__,ParameterDictionary *this,int indentCount)

{
  size_t sVar1;
  ParameterDictionary *this_00;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar2;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar3;
  undefined4 in_register_00000014;
  long lVar4;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  paVar3 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
            *)(this->params).ptr;
  sVar1 = (this->params).nStored;
  paVar2 = &(this->params).field_2;
  if (paVar3 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                 *)0x0) {
    paVar2 = paVar3;
  }
  paVar3 = paVar2;
  for (lVar4 = 0; sVar1 << 3 != lVar4; lVar4 = lVar4 + 8) {
    this_00 = *(ParameterDictionary **)((long)paVar2 + lVar4);
    std::__cxx11::string::append((ulong)__return_storage_ptr__,(char)indentCount + '\x04');
    ToParameterDefinition_abi_cxx11_
              (&local_50,this_00,(ParsedParameter *)CONCAT44(in_register_00000014,indentCount),
               (int)paVar3);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ParameterDictionary::ToParameterList(int indentCount) const {
    std::string s;
    for (const ParsedParameter *p : params) {
        s.append(indentCount + 4, ' ');
        s += ToParameterDefinition(p, indentCount);
        s += "\n";
    }

    return s;
}